

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

void __thiscall Imath_2_5::Matrix33<double>::Matrix33(Matrix33<double> *this,double a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  
  uVar5 = SUB84(a,0);
  uVar6 = (undefined4)((ulong)a >> 0x20);
  auVar1._8_4_ = uVar5;
  auVar1._0_8_ = a;
  auVar1._12_4_ = uVar6;
  *(undefined1 (*) [16])(this->x[0] + 2) = auVar1;
  auVar2._8_4_ = uVar5;
  auVar2._0_8_ = a;
  auVar2._12_4_ = uVar6;
  *(undefined1 (*) [16])this->x[0] = auVar2;
  auVar3._8_4_ = uVar5;
  auVar3._0_8_ = a;
  auVar3._12_4_ = uVar6;
  *(undefined1 (*) [16])this->x[2] = auVar3;
  auVar4._8_4_ = uVar5;
  auVar4._0_8_ = a;
  auVar4._12_4_ = uVar6;
  *(undefined1 (*) [16])(this->x[1] + 1) = auVar4;
  this->x[2][2] = a;
  return;
}

Assistant:

inline
Matrix33<T>::Matrix33 (T a)
{
    x[0][0] = a;
    x[0][1] = a;
    x[0][2] = a;
    x[1][0] = a;
    x[1][1] = a;
    x[1][2] = a;
    x[2][0] = a;
    x[2][1] = a;
    x[2][2] = a;
}